

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O0

uchar PrologEncoderMD::GetNonVolRegToSave(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  RegNum RVar3;
  undefined4 *puVar4;
  Opnd *this;
  RegOpnd *this_00;
  Instr *instr_local;
  
  if (instr->m_opcode != PUSH) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x40,"(instr->m_opcode == Js::OpCode::PUSH)",
                       "instr->m_opcode == Js::OpCode::PUSH");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this = IR::Instr::GetSrc1(instr);
  this_00 = IR::Opnd::AsRegOpnd(this);
  RVar3 = IR::RegOpnd::GetReg(this_00);
  return RVar3 - RegRAX;
}

Assistant:

unsigned __int8 PrologEncoderMD::GetNonVolRegToSave(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::PUSH);
    return (instr->GetSrc1()->AsRegOpnd()->GetReg() - 1) & 0xFF;
}